

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

bool __thiscall
pbrt::Bounds3<float>::IntersectP
          (Bounds3<float> *this,Point3f *o,Vector3f *d,Float tMax,Float *hitt0,Float *hitt1)

{
  undefined1 auVar1 [16];
  float *in_RCX;
  Tuple3<pbrt::Vector3,_float> *in_RDX;
  Tuple3<pbrt::Point3,_float> *in_RSI;
  Tuple3<pbrt::Point3,_float> *in_RDI;
  float *in_R8;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [64];
  Float tFar;
  Float tNear;
  Float invRayDir;
  int i;
  Float t1;
  Float t0;
  float local_68;
  float local_64;
  float local_50;
  float local_4c;
  float local_48;
  int local_44;
  float local_40;
  float local_3c;
  float *local_38;
  float *local_30;
  Tuple3<pbrt::Vector3,_float> *local_20;
  Tuple3<pbrt::Point3,_float> *local_18;
  undefined1 extraout_var [56];
  
  local_3c = 0.0;
  local_44 = 0;
  local_40 = in_XMM0_Da;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if (2 < local_44) {
      if (local_30 != (float *)0x0) {
        *local_30 = local_3c;
      }
      if (local_38 != (float *)0x0) {
        *local_38 = local_40;
      }
      return true;
    }
    local_48 = Tuple3<pbrt::Vector3,_float>::operator[](local_20,local_44);
    local_48 = 1.0 / local_48;
    fVar2 = Tuple3<pbrt::Point3,_float>::operator[](in_RDI,local_44);
    fVar3 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_44);
    local_4c = (fVar2 - fVar3) * local_48;
    fVar2 = Tuple3<pbrt::Point3,_float>::operator[](in_RDI + 1,local_44);
    fVar3 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_44);
    local_50 = (fVar2 - fVar3) * local_48;
    dVar4 = (double)(ulong)(uint)local_4c;
    if (local_50 < local_4c) {
      dVar4 = (double)(ulong)(uint)local_4c;
      pstd::swap<float>(&local_4c,&local_50);
    }
    auVar5._0_8_ = pbrt::gamma(dVar4);
    auVar5._8_56_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar5._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    local_50 = auVar1._0_4_ * local_50;
    if (local_4c <= local_3c) {
      local_64 = local_3c;
    }
    else {
      local_64 = local_4c;
    }
    local_3c = local_64;
    local_68 = local_50;
    if (local_40 <= local_50) {
      local_68 = local_40;
    }
    local_40 = local_68;
    if (local_68 < local_64) break;
    local_44 = local_44 + 1;
  }
  return false;
}

Assistant:

PBRT_CPU_GPU inline bool Bounds3<T>::IntersectP(const Point3f &o, const Vector3f &d,
                                                Float tMax, Float *hitt0,
                                                Float *hitt1) const {
    Float t0 = 0, t1 = tMax;
    for (int i = 0; i < 3; ++i) {
        // Update interval for _i_th bounding box slab
        Float invRayDir = 1 / d[i];
        Float tNear = (pMin[i] - o[i]) * invRayDir;
        Float tFar = (pMax[i] - o[i]) * invRayDir;
        // Update parametric interval from slab intersection $t$ values
        if (tNear > tFar)
            pstd::swap(tNear, tFar);
        // Update _tFar_ to ensure robust ray--bounds intersection
        tFar *= 1 + 2 * gamma(3);

        t0 = tNear > t0 ? tNear : t0;
        t1 = tFar < t1 ? tFar : t1;
        if (t0 > t1)
            return false;
    }
    if (hitt0)
        *hitt0 = t0;
    if (hitt1)
        *hitt1 = t1;
    return true;
}